

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgvalue.c
# Opt level: O2

int mg_map_insert2(mg_map *map,mg_string *key,mg_value *value)

{
  uint uVar1;
  uint32_t uVar2;
  int iVar3;
  
  uVar1 = map->size;
  if (uVar1 < map->capacity) {
    uVar2 = mg_map_find_key(map,key->size,key->data);
    if (uVar2 == uVar1) {
      map->keys[uVar1] = key;
      map->values[uVar1] = value;
      map->size = uVar1 + 1;
      iVar3 = 0;
    }
    else {
      iVar3 = -7;
    }
  }
  else {
    iVar3 = -4;
  }
  return iVar3;
}

Assistant:

int mg_map_insert2(mg_map *map, mg_string *key, mg_value *value) {
  if (map->size >= map->capacity) {
    return MG_ERROR_CONTAINER_FULL;
  }
  if (mg_map_find_key(map, key->size, key->data) != map->size) {
    return MG_ERROR_DUPLICATE_KEY;
  }
  mg_map_append(map, key, value);
  return 0;
}